

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUIFont::draw
          (CGUIFont *this,stringw *text,rect<int> *position,SColor color,bool hcenter,bool vcenter,
          rect<int> *clip)

{
  bool bVar1;
  int iVar2;
  u32 uVar3;
  s32 sVar4;
  wchar_t *pwVar5;
  SFontArea *pSVar6;
  rect<int> *in_RDX;
  long *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  rect<int> *in_stack_00000008;
  SFontArea *area;
  bool lineBreak;
  wchar_t c;
  u32 i;
  array<irr::core::vector2d<int>_> offsets;
  array<unsigned_int> indices;
  rect<int> clippedRect;
  vector2d<int> offset;
  dimension2d<int> textDimension;
  undefined4 in_stack_ffffffffffffff28;
  wchar_t in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  uint uVar7;
  uint local_94;
  undefined1 local_90 [32];
  undefined1 local_70 [36];
  rect<int> local_4c;
  dimension2d<unsigned_int> local_3c;
  vector2d<int> local_34;
  dimension2d<int> local_2c;
  byte local_22;
  byte local_21;
  rect<int> *local_20;
  undefined1 local_4 [4];
  
  local_21 = (byte)in_R8D & 1;
  local_22 = in_R9B & 1;
  if ((in_RDI[0xb] != 0) && (in_RDI[0xc] != 0)) {
    local_20 = in_RDX;
    core::dimension2d<int>::dimension2d(&local_2c);
    local_34 = local_20->UpperLeftCorner;
    if (((local_21 & 1) != 0) || (((local_22 & 1) != 0 || (in_stack_00000008 != (rect<int> *)0x0))))
    {
      pwVar5 = core::string<wchar_t>::c_str((string<wchar_t> *)0x3b9dd2);
      local_3c = (dimension2d<unsigned_int>)(**(code **)(*in_RDI + 8))(in_RDI,pwVar5);
      core::dimension2d<int>::operator=(&local_2c,&local_3c);
    }
    if ((local_21 & 1) != 0) {
      iVar2 = core::rect<int>::getWidth(local_20);
      local_34.X = (iVar2 - local_2c.Width >> 1) + local_34.X;
    }
    if ((local_22 & 1) != 0) {
      iVar2 = core::rect<int>::getHeight(local_20);
      local_34.Y = (iVar2 - local_2c.Height >> 1) + local_34.Y;
    }
    if (in_stack_00000008 != (rect<int> *)0x0) {
      core::rect<int>::rect<int>
                ((rect<int> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (vector2d<int> *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 (dimension2d<int> *)0x3b9e81);
      core::rect<int>::clipAgainst(&local_4c,in_stack_00000008);
      bVar1 = core::rect<int>::isValid(&local_4c);
      if (!bVar1) {
        return;
      }
    }
    core::string<wchar_t>::size((string<wchar_t> *)0x3b9ebb);
    core::array<unsigned_int>::array
              ((array<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2c);
    core::string<wchar_t>::size((string<wchar_t> *)0x3b9ed4);
    core::array<irr::core::vector2d<int>_>::array
              ((array<irr::core::vector2d<int>_> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2c);
    local_94 = 0;
    while (uVar7 = local_94, uVar3 = core::string<wchar_t>::size((string<wchar_t> *)0x3b9efd),
          uVar7 < uVar3) {
      pwVar5 = core::string<wchar_t>::operator[]
                         ((string<wchar_t> *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff2c);
      if (*pwVar5 == L'\r') {
        bVar1 = true;
        pwVar5 = core::string<wchar_t>::operator[]
                           ((string<wchar_t> *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c);
        if (*pwVar5 == L'\n') {
          local_94 = local_94 + 1;
          core::string<wchar_t>::operator[]
                    ((string<wchar_t> *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff2c);
        }
      }
      else {
        bVar1 = *pwVar5 == L'\n';
      }
      if (bVar1) {
        local_34.Y = *(int *)((long)in_RDI + 0x74) + local_34.Y;
        local_34.X = (local_20->UpperLeftCorner).X;
        if ((local_21 & 1) != 0) {
          iVar2 = core::rect<int>::getWidth(local_20);
          local_34.X = (iVar2 - local_2c.Width >> 1) + local_34.X;
        }
      }
      else {
        getAreaFromCharacter
                  ((CGUIFont *)CONCAT44(in_R8D,uVar7),(wchar_t)((ulong)(in_RDI + 1) >> 0x20));
        pSVar6 = core::array<irr::gui::CGUIFont::SFontArea>::operator[]
                           ((array<irr::gui::CGUIFont::SFontArea> *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c);
        local_34.X = pSVar6->underhang + local_34.X;
        sVar4 = core::string<wchar_t>::findFirst
                          ((string<wchar_t> *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           in_stack_ffffffffffffff2c);
        if (sVar4 < 0) {
          core::array<unsigned_int>::push_back
                    ((array<unsigned_int> *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (uint *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          core::array<irr::core::vector2d<int>_>::push_back
                    ((array<irr::core::vector2d<int>_> *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (vector2d<int> *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
          ;
        }
        local_34.X = pSVar6->width + pSVar6->overhang + (int)in_RDI[0xf] + local_34.X;
      }
      local_94 = local_94 + 1;
    }
    (**(code **)(*(long *)in_RDI[0xc] + 0x50))
              ((long *)in_RDI[0xc],local_70,local_90,in_stack_00000008,local_4,0,0,1,0);
    core::array<irr::core::vector2d<int>_>::~array((array<irr::core::vector2d<int>_> *)0x3ba0dd);
    core::array<unsigned_int>::~array((array<unsigned_int> *)0x3ba0e7);
  }
  return;
}

Assistant:

void CGUIFont::draw(const core::stringw &text, const core::rect<s32> &position,
		video::SColor color,
		bool hcenter, bool vcenter, const core::rect<s32> *clip)
{
	if (!Driver || !SpriteBank)
		return;

	core::dimension2d<s32> textDimension; // NOTE: don't make this u32 or the >> later on can fail when the dimension width is < position width
	core::position2d<s32> offset = position.UpperLeftCorner;

	if (hcenter || vcenter || clip)
		textDimension = getDimension(text.c_str());

	if (hcenter)
		offset.X += (position.getWidth() - textDimension.Width) >> 1;

	if (vcenter)
		offset.Y += (position.getHeight() - textDimension.Height) >> 1;

	if (clip) {
		core::rect<s32> clippedRect(offset, textDimension);
		clippedRect.clipAgainst(*clip);
		if (!clippedRect.isValid())
			return;
	}

	core::array<u32> indices(text.size());
	core::array<core::position2di> offsets(text.size());

	for (u32 i = 0; i < text.size(); i++) {
		wchar_t c = text[i];

		bool lineBreak = false;
		if (c == L'\r') { // Mac or Windows breaks
			lineBreak = true;
			if (text[i + 1] == L'\n') // Windows breaks
				c = text[++i];
		} else if (c == L'\n') { // Unix breaks
			lineBreak = true;
		}

		if (lineBreak) {
			offset.Y += MaxHeight;
			offset.X = position.UpperLeftCorner.X;

			if (hcenter) {
				offset.X += (position.getWidth() - textDimension.Width) >> 1;
			}
			continue;
		}

		SFontArea &area = Areas[getAreaFromCharacter(c)];

		offset.X += area.underhang;
		if (Invisible.findFirst(c) < 0) {
			indices.push_back(area.spriteno);
			offsets.push_back(offset);
		}

		offset.X += area.width + area.overhang + GlobalKerningWidth;
	}

	SpriteBank->draw2DSpriteBatch(indices, offsets, clip, color);
}